

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

Float __thiscall
pbrt::ConductorBxDF::PDF
          (ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  bool bVar1;
  int iVar2;
  BxDFReflTransFlags in_EDX;
  long *in_FS_OFFSET;
  float fVar3;
  Float FVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_ZMM2 [64];
  Vector3<float> VVar8;
  Vector3f wh;
  Vector3<float> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  AccumFunc in_stack_ffffffffffffff78;
  StatRegisterer *in_stack_ffffffffffffff80;
  _lambda_pbrt__StatsAccumulator___1_ local_71;
  Tuple3<pbrt::Vector3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_5c [2];
  Tuple3<pbrt::Vector3,_float> local_3c;
  Tuple3<pbrt::Vector3,_float> local_2c;
  Tuple3<pbrt::Vector3,_float> local_20;
  Tuple3<pbrt::Vector3,_float> local_10;
  undefined1 auVar7 [56];
  
  auVar7 = in_ZMM0._8_56_;
  local_20._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_3c._0_8_ = vmovlpd_avx(in_ZMM2._0_16_);
  local_2c._0_8_ = local_3c._0_8_;
  local_10._0_8_ = local_20._0_8_;
  iVar2 = operator&(in_EDX,Reflection);
  if (((iVar2 != 0) && (bVar1 = SameHemisphere((Vector3f *)&local_10,(Vector3f *)&local_2c), bVar1))
     && (bVar1 = TrowbridgeReitzDistribution::EffectivelySpecular
                           ((TrowbridgeReitzDistribution *)0x7f6f92), !bVar1)) {
    VVar8 = Tuple3<pbrt::Vector3,float>::operator+
                      ((Tuple3<pbrt::Vector3,_float> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    local_70.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar7;
    local_70._0_8_ = vmovlpd_avx(auVar5._0_16_);
    local_5c[0]._0_8_ = local_70._0_8_;
    local_5c[0].z = local_70.z;
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar2 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg), iVar2 != 0)) {
      PDF(pbrt::Vector3,pbrt::Vector3,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const::
      {lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer(&local_71);
      StatRegisterer::StatRegisterer
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (PixelAccumFunc)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(*in_FS_OFFSET + -0xf8) = *(long *)(*in_FS_OFFSET + -0xf8) + 1;
    fVar3 = LengthSquared<float>((Vector3<float> *)local_5c);
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      *(long *)(*in_FS_OFFSET + -0x100) = *(long *)(*in_FS_OFFSET + -0x100) + 1;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar2 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg), iVar2 != 0)) {
      PDF(pbrt::Vector3,pbrt::Vector3,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const::
      {lambda(pbrt::StatsAccumulator&)#2}::operator_cast_to_function_pointer
                ((_lambda_pbrt__StatsAccumulator___2_ *)&stack0xffffffffffffff7b);
      StatRegisterer::StatRegisterer
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (PixelAccumFunc)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(*in_FS_OFFSET + -0xe8) = *(long *)(*in_FS_OFFSET + -0xe8) + 1;
    fVar3 = Dot<float>((Vector3<float> *)&local_10,(Vector3<float> *)local_5c);
    if (fVar3 < 0.0) {
      *(long *)(*in_FS_OFFSET + -0xf0) = *(long *)(*in_FS_OFFSET + -0xf0) + 1;
    }
    fVar3 = LengthSquared<float>((Vector3<float> *)local_5c);
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      fVar3 = Dot<float>((Vector3<float> *)&local_10,(Vector3<float> *)local_5c);
      auVar7 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
      if (0.0 < fVar3) {
        VVar8 = Normalize<float>((Vector3<float> *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        local_5c[0].z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar6._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar6._8_56_ = auVar7;
        local_5c[0]._0_8_ = vmovlpd_avx(auVar6._0_16_);
        FVar4 = TrowbridgeReitzDistribution::PDF
                          ((TrowbridgeReitzDistribution *)
                           CONCAT44(local_5c[0].z,SUB84(local_5c[0]._0_8_,4)),
                           (Vector3f *)CONCAT44((float)local_5c[0]._0_8_,in_stack_ffffffffffffff68),
                           (Vector3f *)CONCAT44(in_stack_ffffffffffffff64,local_5c[0].z));
        fVar3 = Dot<float>((Vector3<float> *)&local_10,(Vector3<float> *)local_5c);
        return FVar4 / (fVar3 * 4.0);
      }
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        if (!SameHemisphere(wo, wi))
            return 0;
        if (mfDistrib.EffectivelySpecular())
            return 0;
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-6, LengthSquared(wh) == 0);
        CHECK_RARE(1e-6, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);
        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh));
    }